

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O0

int main(void)

{
  init_wins();
  test_arcs(d1);
  test_roundtangles(d2);
  test_line_props(d3);
  test_draw_fns(d4);
  test_bboxes(d5);
  test_bitblt();
  test_fill_stipples(d6);
  test_time_string();
  test_font_get();
  printf("Hit RETURN to exit:");
  getchar();
  (**(code **)(*(long *)d1 + 8))();
  return 0;
}

Assistant:

int
main()
{
  init_wins();
  test_arcs(d1);
  test_roundtangles(d2);
  test_line_props(d3); // in testlineprops.cc
  test_draw_fns(d4);
  test_bboxes(d5);
  test_bitblt(); // bitblts from arc window to bbox window
  test_fill_stipples(d6);
  test_time_string();
  test_font_get();

  ///
  ///  Exit
  ///
  printf("Hit RETURN to exit:");
  getchar();
  d1->Destroy();

  return 0;
}